

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lmi_helper.c
# Opt level: O2

uint64_t helper_psrah_mipsel(uint64_t fs,uint64_t ft)

{
  short *psVar1;
  long lVar2;
  byte bVar3;
  uint uVar4;
  LMIValue vs;
  
  uVar4 = (uint)ft & 0x7f;
  bVar3 = 0xf;
  if (uVar4 < 0xf) {
    bVar3 = (byte)uVar4;
  }
  vs.d = fs;
  for (lVar2 = 0; lVar2 != 4; lVar2 = lVar2 + 1) {
    psVar1 = (short *)((long)&vs + lVar2 * 2);
    *psVar1 = *psVar1 >> (bVar3 & 0x1f);
  }
  return vs.d;
}

Assistant:

uint64_t helper_psrah(uint64_t fs, uint64_t ft)
{
    LMIValue vs;
    unsigned i;

    ft &= 0x7f;
    if (ft > 15) {
        ft = 15;
    }
    vs.d = fs;
    for (i = 0; i < 4; ++i) {
        vs.sh[i] >>= ft;
    }
    return vs.d;
}